

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_embedded.cpp
# Opt level: O3

Ref trun::DynLibEmbedded::Create(void)

{
  DynLibEmbedded *pDVar1;
  Version VVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ref RVar3;
  undefined1 local_19;
  
  (in_RDI->super_IDynLibrary)._vptr_IDynLibrary = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trun::DynLibEmbedded,std::allocator<trun::DynLibEmbedded>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(in_RDI->super_IDynLibrary).version,
             (DynLibEmbedded **)in_RDI,(allocator<trun::DynLibEmbedded> *)&local_19);
  pDVar1 = (DynLibEmbedded *)(in_RDI->super_IDynLibrary)._vptr_IDynLibrary;
  (pDVar1->super_IDynLibrary).rawVersion = 0x474e4b5f30323030;
  VVar2 = TestLibVersion::FromVersion(0x474e4b5f30323030);
  (pDVar1->super_IDynLibrary).version = VVar2;
  RVar3.super___shared_ptr<trun::DynLibEmbedded,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar3.super___shared_ptr<trun::DynLibEmbedded,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar3.super___shared_ptr<trun::DynLibEmbedded,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DynLibEmbedded::Ref DynLibEmbedded::Create() {
    auto ref =  std::make_shared<DynLibEmbedded>();
#ifdef TRUN_USE_V1
#else
    ref->SetVersion(STR_TO_VER("GNK_0200"));
#endif
    return ref;
}